

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,int port,XMLCh *userinfo,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLCh *local_38;
  XMLCh *tmpStr;
  MemoryManager *manager_local;
  XMLCh *userinfo_local;
  int port_local;
  XMLCh *host_local;
  
  bVar1 = isWellFormedAddress(host,manager);
  if (bVar1) {
    if ((port < 0x10000) && ((-1 < port || (port == -1)))) {
      local_38 = userinfo;
      if (userinfo == (XMLCh *)0x0) {
        host_local._7_1_ = true;
      }
      else {
        while (*local_38 != L'\0') {
          bVar1 = isUnreservedCharacter(*local_38);
          if ((bVar1) ||
             (iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*local_38), iVar2 != -1)) {
            local_38 = local_38 + 1;
          }
          else {
            if (*local_38 != L'%') {
              return false;
            }
            XVar3 = XMLString::stringLen(local_38);
            if (((XVar3 < 3) || (bVar1 = XMLString::isHex(local_38[1]), !bVar1)) ||
               (bVar1 = XMLString::isHex(local_38[2]), !bVar1)) {
              return false;
            }
            local_38 = local_38 + 3;
          }
        }
        host_local._7_1_ = true;
      }
    }
    else {
      host_local._7_1_ = false;
    }
  }
  else {
    host_local._7_1_ = false;
  }
  return host_local._7_1_;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host
                                         , const int port
                                         , const XMLCh* const userinfo
                                         , MemoryManager* const manager)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, manager))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    if (!userinfo)
        return true;

    const XMLCh* tmpStr = userinfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}